

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit_writer_utils.c
# Opt level: O2

int VP8PutBitUniform(VP8BitWriter *bw,int bit)

{
  int iVar1;
  
  iVar1 = bw->range >> 1;
  if (bit != 0) {
    bw->value = bw->value + iVar1 + 1;
    iVar1 = bw->range - (iVar1 + 1);
  }
  bw->range = iVar1;
  if (iVar1 < 0x7f) {
    bw->range = (uint)kNewRange[iVar1];
    bw->value = bw->value << 1;
    iVar1 = bw->nb_bits;
    bw->nb_bits = iVar1 + 1;
    if (-1 < iVar1) {
      Flush(bw);
    }
  }
  return bit;
}

Assistant:

int VP8PutBitUniform(VP8BitWriter* const bw, int bit) {
  const int split = bw->range >> 1;
  if (bit) {
    bw->value += split + 1;
    bw->range -= split + 1;
  } else {
    bw->range = split;
  }
  if (bw->range < 127) {
    bw->range = kNewRange[bw->range];
    bw->value <<= 1;
    bw->nb_bits += 1;
    if (bw->nb_bits > 0) Flush(bw);
  }
  return bit;
}